

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

ON__UINT64 __thiscall
ON_SerialNumberMap::GarbageCollectMoveHelper
          (ON_SerialNumberMap *this,ON_SN_BLOCK *dst,ON_SN_BLOCK *src)

{
  SN_ELEMENT *pSVar1;
  uint uVar2;
  undefined8 uVar3;
  ON__UINT64 OVar4;
  undefined8 uVar5;
  MAP_VALUE *pMVar6;
  ON__UINT32 OVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  ON__UINT32 OVar10;
  ON__UINT32 OVar11;
  uint uVar12;
  ulong uVar13;
  ON__UINT32 OVar14;
  uint uVar15;
  uint uVar16;
  SN_ELEMENT *__src;
  
  uVar12 = 0;
  if (dst == (ON_SN_BLOCK *)0x0 || src == (ON_SN_BLOCK *)0x0) goto LAB_004d665f;
  uVar16 = 0x2000 - dst->m_count;
  uVar2 = src->m_count;
  uVar15 = uVar16;
  if (uVar2 < uVar16) {
    uVar15 = uVar2;
  }
  if (uVar15 == 0) goto LAB_004d665f;
  if (dst->m_count == 0) {
    dst->m_count = 0;
    dst->m_purged = 0;
    dst->m_sorted = 1;
    dst->m_sn0 = 0;
    dst->m_sn1 = 0;
  }
  if ((src->m_sorted == 0) && (dst->m_sorted = 0, dst->m_count == 0)) {
    dst->m_sn0 = src->m_sn0;
    dst->m_sn1 = src->m_sn1;
  }
  __src = src->m_sn;
  memcpy(dst->m_sn + dst->m_count,__src,(ulong)uVar15 * 0x38);
  OVar10 = dst->m_count + uVar15;
  dst->m_count = OVar10;
  if (dst->m_sorted == 0) {
    if (src->m_sn0 < dst->m_sn0) {
      dst->m_sn0 = src->m_sn0;
    }
    uVar13 = src->m_sn1;
    if (dst->m_sn1 < uVar13) goto LAB_004d65e7;
  }
  else {
    dst->m_sn0 = dst->m_sn[0].m_sn;
    uVar13 = dst->m_sn[OVar10 - 1].m_sn;
LAB_004d65e7:
    dst->m_sn1 = uVar13;
  }
  OVar11 = src->m_count - uVar15;
  OVar10 = 0;
  if (uVar15 <= src->m_count && OVar11 != 0) {
    if (uVar2 < uVar16) {
      uVar16 = uVar2;
    }
    OVar14 = OVar11;
    do {
      (__src->m_value).m_u = __src[uVar16].m_value.m_u;
      pSVar1 = __src + uVar16;
      uVar12 = (pSVar1->m_id).Data1;
      uVar8 = (pSVar1->m_id).Data2;
      uVar9 = (pSVar1->m_id).Data3;
      uVar3 = *(undefined8 *)(pSVar1->m_id).Data4;
      OVar4 = __src[uVar16].m_sn;
      uVar5 = (&__src[uVar16].m_sn)[1];
      pMVar6 = (MAP_VALUE *)(&__src[uVar16].m_next + 1);
      OVar10 = pMVar6->m_u_type;
      OVar7 = pMVar6->m_u32;
      __src->m_next = __src[uVar16].m_next;
      (__src->m_value).m_u_type = OVar10;
      (__src->m_value).m_u32 = OVar7;
      __src->m_sn = OVar4;
      *(undefined8 *)&__src->m_sn_active = uVar5;
      (__src->m_id).Data1 = uVar12;
      (__src->m_id).Data2 = uVar8;
      (__src->m_id).Data3 = uVar9;
      *(undefined8 *)(__src->m_id).Data4 = uVar3;
      __src = __src + 1;
      OVar14 = OVar14 - 1;
      OVar10 = OVar11;
    } while (OVar14 != 0);
  }
  src->m_count = OVar10;
  uVar12 = uVar15;
  if (OVar10 == 0) {
    src->m_count = 0;
    src->m_purged = 0;
    src->m_sorted = 1;
    src->m_sn0 = 0;
    src->m_sn1 = 0;
  }
  else if (src->m_sorted != 0) {
    src->m_sn0 = src->m_sn[0].m_sn;
  }
LAB_004d665f:
  return (ulong)uVar12;
}

Assistant:

ON__UINT64 ON_SerialNumberMap::GarbageCollectMoveHelper(ON_SN_BLOCK* dst,ON_SN_BLOCK* src)
{
  // This helper is used by GarbageCollectHelper and moves
  // as many entries as possible from src to dst.  
  // Returns: the number of entries transferred.
  ON__UINT32 i,j,n;
  if ( src && dst )
  {
    n = ON_SN_BLOCK::SN_BLOCK_CAPACITY - dst->m_count;
    if ( src->m_count < n )
      n = src->m_count;
    if ( n > 0 )
    {
      if ( 0 == dst->m_count )
      {
        dst->EmptyBlock();
      }
      if ( 0 == src->m_sorted )
      {
        dst->m_sorted = 0;
        if ( 0 == dst->m_count )
        {
          dst->m_sn0 = src->m_sn0;
          dst->m_sn1 = src->m_sn1;
        }
      }
      memcpy(&dst->m_sn[dst->m_count],&src->m_sn[0],(size_t)(n*sizeof(src->m_sn[0])));
      dst->m_count += n;
      if ( dst->m_sorted )
      {
        dst->m_sn0 = dst->m_sn[0].m_sn; // set m_sn0 because input dst could have count 0
        dst->m_sn1 = dst->m_sn[dst->m_count-1].m_sn;
      }
      else 
      {
        if ( dst->m_sn0 > src->m_sn0 )
          dst->m_sn0 = src->m_sn0;
        if ( dst->m_sn1 < src->m_sn1 )
          dst->m_sn1 = src->m_sn1;
      }
      i = 0; j = n;
      while ( j < src->m_count )
      {
        src->m_sn[i++] = src->m_sn[j++];
      }
      src->m_count = i;
      if ( src->m_count > 0 )
      {
        if ( src->m_sorted )
          src->m_sn0 = src->m_sn[0].m_sn;
      }
      else
      {
        src->EmptyBlock();
      }
    }
  }
  else
  {
    n = 0;
  }
  return n;
}